

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void Catch::cleanupSingletons(void)

{
  long *plVar1;
  undefined8 *puVar2;
  long *plVar3;
  
  if ((anonymous_namespace)::getSingletons()::g_singletons == (undefined8 *)0x0) {
    (anonymous_namespace)::getSingletons()::g_singletons = (undefined8 *)operator_new(0x18);
    *(anonymous_namespace)::getSingletons()::g_singletons = 0;
    (anonymous_namespace)::getSingletons()::g_singletons[1] = 0;
    (anonymous_namespace)::getSingletons()::g_singletons[2] = 0;
  }
  plVar1 = (long *)(anonymous_namespace)::getSingletons()::g_singletons[1];
  for (plVar3 = (long *)*(anonymous_namespace)::getSingletons()::g_singletons;
      puVar2 = (anonymous_namespace)::getSingletons()::g_singletons, plVar3 != plVar1;
      plVar3 = plVar3 + 1) {
    if ((long *)*plVar3 != (long *)0x0) {
      (**(code **)(*(long *)*plVar3 + 8))();
    }
  }
  if ((anonymous_namespace)::getSingletons()::g_singletons != (undefined8 *)0x0) {
    if ((void *)*(anonymous_namespace)::getSingletons()::g_singletons != (void *)0x0) {
      operator_delete((void *)*(anonymous_namespace)::getSingletons()::g_singletons);
    }
    operator_delete(puVar2);
  }
  (anonymous_namespace)::getSingletons()::g_singletons = (undefined8 *)0x0;
  return;
}

Assistant:

static auto getSingletons() -> std::vector<ISingleton*>*& {
            static std::vector<ISingleton*>* g_singletons = nullptr;
            if( !g_singletons )
                g_singletons = new std::vector<ISingleton*>();
            return g_singletons;
        }